

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall
fasttext::DenseMatrix::addVectorToRow(DenseMatrix *this,Vector *vec,int64_t i,real a)

{
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 in_register_00001204 [12];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x7f,
                  "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)"
                 );
  }
  if (i < (this->super_Matrix).m_) {
    uVar1 = (vec->data_).size_;
    if (uVar1 == (this->super_Matrix).n_) {
      pfVar2 = (vec->data_).mem_;
      pfVar3 = (this->data_).mem_;
      for (uVar5 = 0; (~((long)uVar1 >> 0x3f) & uVar1) != uVar5; uVar5 = uVar5 + 1) {
        auVar4._4_12_ = in_register_00001204;
        auVar4._0_4_ = a;
        auVar4 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[uVar5]),auVar4,
                                 ZEXT416((uint)pfVar3[i * uVar1 + uVar5]));
        pfVar3[i * uVar1 + uVar5] = auVar4._0_4_;
      }
      return;
    }
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x81,
                  "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)"
                 );
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                ,0x80,
                "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)")
  ;
}

Assistant:

void DenseMatrix::addVectorToRow(const Vector& vec, int64_t i, real a) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  for (int64_t j = 0; j < n_; j++) {
    data_[i * n_ + j] += a * vec[j];
  }
}